

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintMessage
          (PyiGenerator *this,Descriptor *message_descriptor,bool is_nested)

{
  ushort uVar1;
  ushort *puVar2;
  Printer *pPVar3;
  FieldDescriptor *pFVar4;
  FieldDescriptor *pFVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar6;
  byte bVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  EnumDescriptor *descriptor;
  Nonnull<const_char_*> pcVar11;
  AlphaNum *in_RCX;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *pcVar12;
  undefined8 extraout_RDX_00;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_00;
  AlphaNum *pAVar16;
  int iVar17;
  long lVar18;
  string_view text;
  string_view name_02;
  string_view text_00;
  string_view begin_varname;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view begin_varname_00;
  string_view text_08;
  string_view name_03;
  string_view text_09;
  string_view text_10;
  string_view begin_varname_01;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string self_arg_name;
  string field_type;
  string field_name;
  string extra_base;
  string_view class_name;
  string *__return_storage_ptr__;
  PyiGenerator *this_01;
  PyiGenerator *this_02;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  undefined1 local_188 [48];
  Descriptor *local_158;
  undefined1 local_150 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  ulong local_70;
  Descriptor *local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  pcVar12 = (char *)CONCAT71(in_register_00000011,is_nested);
  if ((int)pcVar12 == 0) {
    text._M_str = "\n";
    text._M_len = 1;
    io::Printer::Print<>(this->printer_,text);
    pcVar12 = extraout_RDX;
  }
  puVar2 = (ushort *)(message_descriptor->all_names_).payload_;
  local_60._M_len = (size_t)*puVar2;
  local_60._M_str = (char *)((long)puVar2 + ~local_60._M_len);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  name_02._M_len = (long)puVar2 + ~(ulong)puVar2[1];
  name_02._M_str = pcVar12;
  bVar6 = IsWellKnownType((python *)(ulong)puVar2[1],name_02);
  if (bVar6) {
    local_1b8._0_8_ = &DAT_00000014;
    local_1b8._8_8_ = ", _well_known_types.";
    local_100._0_8_ = ZEXT28(*puVar2);
    local_100._8_8_ = (long)puVar2 + ~local_100._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_188,(lts_20250127 *)local_1b8,(AlphaNum *)local_100,in_RCX);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_188);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,0x10f75f1);
  }
  text_00._M_str = "class $class_name$(_message.Message$extra_base$):\n";
  text_00._M_len = 0x32;
  io::Printer::
  Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[11],std::__cxx11::string>
            (this->printer_,text_00,(char (*) [11])0x12ef1fe,&local_60,(char (*) [11])"extra_base",
             &local_d0);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"class_name","");
  __return_storage_ptr__ = (string *)0x0;
  begin_varname._M_str = (char *)local_1b8._0_8_;
  begin_varname._M_len = local_1b8._8_8_;
  end_varname._M_str = (char *)local_1b8._0_8_;
  end_varname._M_len = local_1b8._8_8_;
  pDVar10 = message_descriptor;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (this->printer_,begin_varname,end_varname,message_descriptor,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  pPVar3 = this->printer_;
  pPVar3->indent_ = pPVar3->indent_ + (pPVar3->options_).spaces_per_indent;
  text_01._M_str = "__slots__ = (";
  text_01._M_len = 0xd;
  io::Printer::Print<>(pPVar3,text_01);
  if (message_descriptor->field_count_ < 1) {
    uVar14 = 2;
    pcVar12 = ")\n";
  }
  else {
    lVar13 = 0;
    lVar18 = 8;
    iVar17 = 0;
    do {
      pFVar9 = message_descriptor->fields_;
      name._M_str = (char *)this;
      name._M_len = (size_t)__return_storage_ptr__;
      bVar6 = IsPythonKeyword(name);
      if (!bVar6) {
        if (0 < iVar17) {
          text_02._M_str = ", ";
          text_02._M_len = 2;
          io::Printer::Print<>(this->printer_,text_02);
        }
        puVar2 = *(ushort **)(&pFVar9->super_SymbolBase + lVar18);
        local_1b8._0_8_ = ZEXT28(*puVar2);
        local_1b8._8_8_ = ~local_1b8._0_8_ + (long)puVar2;
        text_03._M_str = "\"$field_name$\"";
        text_03._M_len = 0xe;
        io::Printer::Print<char[11],std::basic_string_view<char,std::char_traits<char>>>
                  (this->printer_,text_03,(char (*) [11])0x132b2b4,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_1b8);
        iVar17 = iVar17 + 1;
      }
      lVar13 = lVar13 + 1;
      lVar18 = lVar18 + 0x58;
    } while (lVar13 < message_descriptor->field_count_);
    pcVar12 = ")\n";
    if (iVar17 == 1) {
      pcVar12 = ",)\n";
    }
    uVar14 = (ulong)(iVar17 == 1) | 2;
  }
  text_04._M_str = pcVar12;
  text_04._M_len = uVar14;
  this_01 = this;
  io::Printer::Print<>(this->printer_,text_04);
  if (0 < message_descriptor->extension_range_count_) {
    text_05._M_str = "Extensions: _python_message._ExtensionDict\n";
    text_05._M_len = 0x2b;
    io::Printer::Print<>(this->printer_,text_05);
  }
  if (0 < message_descriptor->enum_type_count_) {
    lVar13 = 0;
    lVar18 = 0;
    do {
      PrintEnum(this,(EnumDescriptor *)(&message_descriptor->enum_types_->super_SymbolBase + lVar13)
               );
      if (message_descriptor->enum_type_count_ <= lVar18) {
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,(long)message_descriptor->enum_type_count_,
                             "index < enum_type_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa8b,pcVar11);
        goto LAB_00e29b61;
      }
      PrintEnumValues(this,(EnumDescriptor *)
                           (&message_descriptor->enum_types_->super_SymbolBase + lVar13),false);
      lVar18 = lVar18 + 1;
      lVar13 = lVar13 + 0x58;
    } while (lVar18 < message_descriptor->enum_type_count_);
  }
  if (0 < message_descriptor->nested_type_count_) {
    lVar13 = 0;
    lVar18 = 0;
    do {
      PrintMessage(this,(Descriptor *)
                        (&message_descriptor->nested_types_->super_SymbolBase + lVar13),true);
      lVar18 = lVar18 + 1;
      lVar13 = lVar13 + 0xa0;
    } while (lVar18 < message_descriptor->nested_type_count_);
  }
  PrintExtensions<google::protobuf::Descriptor>(this,message_descriptor);
  if (0 < message_descriptor->field_count_) {
    lVar13 = 8;
    lVar18 = 0;
    local_68 = message_descriptor;
    do {
      pPVar3 = this->printer_;
      puVar2 = *(ushort **)(&message_descriptor->fields_->super_SymbolBase + lVar13);
      uVar1 = *puVar2;
      local_150._0_8_ = local_150 + 0x10;
      local_150._8_8_ =
           (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            )0x0;
      local_150[0x10] = '\0';
      std::__cxx11::string::resize((ulong)local_150,(char)uVar1);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper
                ((Nonnull<char_*>)local_150._0_8_,
                 (Nullable<const_char_*>)((long)puVar2 + ~(ulong)uVar1),(ulong)uVar1);
      local_1b8._0_8_ = local_150._8_8_;
      local_1b8._8_8_ = local_150._0_8_;
      local_100._0_8_ = &DAT_0000000d;
      local_100._8_8_ = "_FIELD_NUMBER";
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_188,(lts_20250127 *)local_1b8,(AlphaNum *)local_100,
                 (AlphaNum *)local_150._8_8_);
      text_06._M_str = "$field_number_name$: _ClassVar[int]\n";
      text_06._M_len = 0x24;
      this = this_01;
      io::Printer::Print<char[18],std::__cxx11::string>
                (pPVar3,text_06,(char (*) [18])"field_number_name",(string *)local_188);
      message_descriptor = local_68;
      this_01 = this;
      if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
        operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
      }
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,CONCAT71(local_150._17_7_,local_150[0x10]) + 1);
      }
      lVar18 = lVar18 + 1;
      lVar13 = lVar13 + 0x58;
    } while (lVar18 < message_descriptor->field_count_);
    if (0 < message_descriptor->field_count_) {
      lVar13 = 0;
      lVar18 = 0;
      do {
        pFVar9 = message_descriptor->fields_;
        name_00._M_str = (char *)this_01;
        name_00._M_len = (size_t)__return_storage_ptr__;
        bVar6 = IsPythonKeyword(name_00);
        if (!bVar6) {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,anon_var_dwarf_a22956 + 5);
          local_158 = (Descriptor *)(&pFVar9->super_SymbolBase + lVar13);
          if (((&pFVar9->type_)[lVar13] == '\v') &&
             (bVar6 = FieldDescriptor::is_map_message_type((FieldDescriptor *)local_158), bVar6)) {
            pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)local_158);
            if ((long)pDVar8->field_count_ < 1) {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (0,(long)pDVar8->field_count_,"index < field_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xa88,pcVar11);
LAB_00e29b61:
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)local_1b8);
            }
            pFVar4 = pDVar8->fields_;
            pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)local_158);
            if ((long)pDVar8->field_count_ < 2) {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (1,(long)pDVar8->field_count_,"index < field_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xa88,pcVar11);
              goto LAB_00e29b61;
            }
            pFVar5 = pDVar8->fields_;
            local_1b8._8_8_ = "_containers.ScalarMap[";
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5[1].type_ * 4) == 10) {
              local_1b8._8_8_ = "_containers.MessageMap[";
            }
            local_1b8._0_8_ =
                 (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5[1].type_ * 4)
                        == 10) | 0x16;
            GetFieldType_abi_cxx11_((string *)local_90,this,pFVar4,message_descriptor);
            local_100._0_8_ = local_90._8_8_;
            local_100._8_8_ = local_90._0_8_;
            local_188._0_8_ = (char *)0x2;
            local_188._8_8_ = (long)"\"$field_name$\", " + 0xe;
            GetFieldType_abi_cxx11_((string *)local_b0,this,pFVar5 + 1,message_descriptor);
            local_150._0_8_ = local_b0._8_8_;
            local_150._8_8_ = local_b0._0_8_;
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_50,(lts_20250127 *)local_1b8,(AlphaNum *)local_100,
                       (AlphaNum *)local_188,(AlphaNum *)local_150,(AlphaNum *)pDVar10);
            std::__cxx11::string::operator=((string *)&local_120,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((AlphaNum *)local_b0._0_8_ != (AlphaNum *)(local_b0 + 0x10)) {
              operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
            }
            sVar15 = local_90._16_8_;
            pAVar16 = (AlphaNum *)local_90._0_8_;
            if ((AlphaNum *)local_90._0_8_ != (AlphaNum *)(local_90 + 0x10)) goto LAB_00e29212;
          }
          else {
            bVar7 = (&pFVar9->field_0x1)[lVar13];
            bVar6 = (bool)((bVar7 & 0x20) >> 5);
            if (0xbf < bVar7 != bVar6) {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar6,0xbf < bVar7,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar11);
              goto LAB_00e29b61;
            }
            if ((bVar7 & 0x20) != 0) {
              pcVar12 = "_containers.RepeatedScalarFieldContainer[";
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar13] * 4)
                  == 10) {
                pcVar12 = "_containers.RepeatedCompositeFieldContainer[";
              }
              std::__cxx11::string::_M_replace
                        ((ulong)&local_120,0,(char *)local_120._M_string_length,(ulong)pcVar12);
            }
            GetFieldType_abi_cxx11_
                      ((string *)local_1b8,this,(FieldDescriptor *)local_158,message_descriptor);
            std::__cxx11::string::_M_append((char *)&local_120,local_1b8._0_8_);
            sVar15 = local_1a8._0_8_;
            pAVar16 = (AlphaNum *)local_1b8._0_8_;
            if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)local_1a8) {
LAB_00e29212:
              operator_delete(pAVar16,sVar15 + 1);
            }
          }
          bVar7 = (&pFVar9->field_0x1)[lVar13];
          bVar6 = (bool)((bVar7 & 0x20) >> 5);
          if (0xbf < bVar7 != bVar6) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar6,0xbf < bVar7,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar11);
            goto LAB_00e29b61;
          }
          this = this_01;
          if ((bVar7 & 0x20) != 0) {
            local_1b8._0_8_ = (pointer)0x1;
            local_1b8._8_8_ = (long)"repeated_nested_enum: [  FOO , ]" + 0x1f;
            absl::lts_20250127::StrAppend(&local_120,(AlphaNum *)local_1b8);
            this = this_01;
          }
          puVar2 = (ushort *)((DescriptorNames *)&local_158->field_count_)->payload_;
          local_1b8._0_8_ = ZEXT28(*puVar2);
          local_1b8._8_8_ = ~local_1b8._0_8_ + (long)puVar2;
          text_07._M_str = "$name$: $type$\n";
          text_07._M_len = 0xf;
          io::Printer::
          Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
                    (this->printer_,text_07,(char (*) [5])0x10a9ad3,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
                     (char (*) [5])0x10fbe0b,&local_120);
          local_1b8._0_8_ = local_1a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"name","");
          __return_storage_ptr__ = (string *)0x0;
          begin_varname_00._M_str = (char *)local_1b8._0_8_;
          begin_varname_00._M_len = local_1b8._8_8_;
          end_varname_00._M_str = (char *)local_1b8._0_8_;
          end_varname_00._M_len = local_1b8._8_8_;
          pDVar10 = local_158;
          io::Printer::Annotate<google::protobuf::FieldDescriptor>
                    (this->printer_,begin_varname_00,end_varname_00,(FieldDescriptor *)local_158,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
          if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
          }
          this_01 = this;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        lVar18 = lVar18 + 1;
        lVar13 = lVar13 + 0x58;
      } while (lVar18 < message_descriptor->field_count_);
    }
  }
  text_08._M_str = "def __init__(";
  text_08._M_len = 0xd;
  io::Printer::Print<>(this->printer_,text_08);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"self","");
  while (name_03._M_str = (char *)local_1b8._0_8_, name_03._M_len = local_1b8._8_8_,
        pFVar9 = Descriptor::FindFieldByName(message_descriptor,name_03),
        pFVar9 != (FieldDescriptor *)0x0) {
    std::__cxx11::string::append(local_1b8);
  }
  text_09._M_str = (char *)local_1b8._0_8_;
  text_09._M_len = local_1b8._8_8_;
  io::Printer::Print<>(this->printer_,text_09);
  if (0 < message_descriptor->field_count_) {
    pDVar10 = (Descriptor *)0x0;
    uVar14 = 0;
    do {
      lVar13 = (long)pDVar10 * 0x58;
      local_70 = uVar14;
      while( true ) {
        pFVar9 = message_descriptor->fields_;
        name_01._M_str = (char *)this_01;
        name_01._M_len = (size_t)__return_storage_ptr__;
        local_158 = pDVar10;
        bVar6 = IsPythonKeyword(name_01);
        if (bVar6) break;
        puVar2 = *(ushort **)((long)&(pFVar9->all_names_).payload_ + lVar13);
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,~(ulong)*puVar2 + (long)puVar2,(long)puVar2 + -1);
        text_10._M_str = ", $field_name$: ";
        text_10._M_len = 0x10;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (this_01->printer_,text_10,(char (*) [11])0x132b2b4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"field_name","");
        pFVar4 = (FieldDescriptor *)(&pFVar9->super_SymbolBase + lVar13);
        __return_storage_ptr__ = (string *)0x0;
        begin_varname_01._M_str = (char *)local_188._0_8_;
        begin_varname_01._M_len = local_188._8_8_;
        end_varname_01._M_str = (char *)local_188._0_8_;
        end_varname_01._M_len = local_188._8_8_;
        this_00._M_head_impl = (LogMessageData *)local_188._8_8_;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (this_01->printer_,begin_varname_01,end_varname_01,pFVar4,
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          this_00._M_head_impl = (LogMessageData *)(local_188._16_8_ + 1);
          operator_delete((void *)local_188._0_8_,(ulong)this_00._M_head_impl);
        }
        bVar7 = (&pFVar9->field_0x1)[lVar13];
        bVar6 = (bool)((bVar7 & 0x20) >> 5);
        if (0xbf < bVar7 != bVar6) {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar6,0xbf < bVar7,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_188,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar11);
          goto LAB_00e29a2f;
        }
        if (((bVar7 & 0x20) != 0) ||
           (bVar7 = (&pFVar9->type_)[lVar13],
           *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar7 * 4) != 7)) {
          text_11._M_str = "_Optional[";
          text_11._M_len = 10;
          this_00._M_head_impl = (LogMessageData *)&DAT_0000000a;
          io::Printer::Print<>(this_01->printer_,text_11);
          bVar7 = (&pFVar9->type_)[lVar13];
        }
        this_02 = this_01;
        if ((bVar7 == 0xb) &&
           (bVar6 = FieldDescriptor::is_map_message_type(pFVar4), this_02 = this_01, bVar6)) {
          pDVar10 = FieldDescriptor::message_type(pFVar4);
          if ((long)pDVar10->field_count_ < 1) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (0,(long)pDVar10->field_count_,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_150,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_150);
          }
          pPVar3 = this_01->printer_;
          GetFieldType_abi_cxx11_((string *)local_188,this_01,pDVar10->fields_,message_descriptor);
          if ((long)pDVar10->field_count_ < 2) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (1,(long)pDVar10->field_count_,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_120,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_120);
          }
          __return_storage_ptr__ = (string *)local_150;
          GetFieldType_abi_cxx11_
                    (__return_storage_ptr__,this_01,pDVar10->fields_ + 1,message_descriptor);
          text_12._M_str = "_Mapping[$key_type$, $value_type$]";
          text_12._M_len = 0x22;
          io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
                    (pPVar3,text_12,(char (*) [9])0x113a793,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     (char (*) [11])0x113a7aa,__return_storage_ptr__);
          if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
            operator_delete((void *)local_150._0_8_,CONCAT71(local_150._17_7_,local_150[0x10]) + 1);
          }
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
          }
        }
        else {
          bVar7 = (&pFVar9->field_0x1)[lVar13];
          bVar6 = (bool)((bVar7 & 0x20) >> 5);
          if (0xbf < bVar7 != bVar6) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar6,0xbf < bVar7,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_188,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar11);
            goto LAB_00e29a2f;
          }
          if ((bVar7 & 0x20) != 0) {
            text_13._M_str = "_Iterable[";
            text_13._M_len = 10;
            this_00._M_head_impl = (LogMessageData *)&DAT_0000000a;
            io::Printer::Print<>(this_02->printer_,text_13);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar13] * 4) ==
              8) {
            pPVar3 = this_02->printer_;
            this_01 = this_02;
            descriptor = FieldDescriptor::enum_type(pFVar4);
            ModuleLevelName<google::protobuf::EnumDescriptor>
                      ((string *)local_188,this_02,descriptor);
            text_15._M_str = "_Union[$type_name$, str]";
            text_15._M_len = 0x18;
            io::Printer::Print<char[10],std::__cxx11::string>
                      (pPVar3,text_15,(char (*) [10])0x13a01d8,(string *)local_188);
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) goto LAB_00e29797;
          }
          else {
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar13] * 4)
                == 10) {
              pDVar10 = FieldDescriptor::message_type(pFVar4);
              ExtraInitTypes_abi_cxx11_
                        ((string *)local_188,(PyiGenerator *)this_00._M_head_impl,pDVar10);
              pPVar3 = this_02->printer_;
              __return_storage_ptr__ = (string *)local_150;
              GetFieldType_abi_cxx11_(__return_storage_ptr__,this_02,pFVar4,message_descriptor);
              text_14._M_str = "_Union[$extra_init_types$$type_name$, _Mapping]";
              text_14._M_len = 0x2f;
              io::Printer::Print<char[17],std::__cxx11::string,char[10],std::__cxx11::string>
                        (pPVar3,text_14,(char (*) [17])"extra_init_types",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,(char (*) [10])0x13a01d8,__return_storage_ptr__);
              if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
                operator_delete((void *)local_150._0_8_,
                                CONCAT71(local_150._17_7_,local_150[0x10]) + 1);
              }
            }
            else {
              pPVar3 = this_02->printer_;
              GetFieldType_abi_cxx11_((string *)local_188,this_02,pFVar4,message_descriptor);
              text_16._M_str = "$type_name$";
              text_16._M_len = 0xb;
              io::Printer::Print<char[10],std::__cxx11::string>
                        (pPVar3,text_16,(char (*) [10])0x13a01d8,(string *)local_188);
            }
            this_01 = this_02;
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
LAB_00e29797:
              operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
            }
          }
          bVar7 = (&pFVar9->field_0x1)[lVar13];
          bVar6 = (bool)((bVar7 & 0x20) >> 5);
          if (0xbf < bVar7 != bVar6) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar6,0xbf < bVar7,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_188,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar11);
            goto LAB_00e29a2f;
          }
          if ((bVar7 & 0x20) != 0) {
            text_17._M_str = "]";
            text_17._M_len = 1;
            io::Printer::Print<>(this_01->printer_,text_17);
          }
        }
        bVar7 = (&pFVar9->field_0x1)[lVar13];
        bVar6 = (bool)((bVar7 & 0x20) >> 5);
        if (0xbf < bVar7 != bVar6) {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar6,0xbf < bVar7,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_188,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar11);
LAB_00e29a2f:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_188);
        }
        if (((bVar7 & 0x20) != 0) ||
           (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar13] * 4) != 7)
           ) {
          text_18._M_str = "]";
          text_18._M_len = 1;
          io::Printer::Print<>(this_01->printer_,text_18);
        }
        text_19._M_str = " = ...";
        text_19._M_len = 6;
        io::Printer::Print<>(this_01->printer_,text_19);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        pDVar10 = (Descriptor *)&local_158->field_0x1;
        lVar13 = lVar13 + 0x58;
        if ((long)message_descriptor->field_count_ <= (long)pDVar10) {
          if ((local_70 & 1) == 0) goto LAB_00e298be;
          goto LAB_00e298a4;
        }
      }
      pDVar10 = (Descriptor *)&local_158->field_0x1;
      uVar14 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    } while ((long)pDVar10 < (long)message_descriptor->field_count_);
LAB_00e298a4:
    text_20._M_str = ", **kwargs";
    text_20._M_len = 10;
    io::Printer::Print<>(this_01->printer_,text_20);
  }
LAB_00e298be:
  text_21._M_str = ") -> None: ...\n";
  text_21._M_len = 0xf;
  io::Printer::Print<>(this_01->printer_,text_21);
  io::Printer::Outdent(this_01->printer_);
  if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void PyiGenerator::PrintMessage(const Descriptor& message_descriptor,
                                bool is_nested) const {
  if (!is_nested) {
    printer_->Print("\n");
  }
  const absl::string_view class_name = message_descriptor.name();
  std::string extra_base;
  // A well-known type needs to inherit from its corresponding base class in
  // net/proto2/python/internal/well_known_types.
  if (IsWellKnownType(message_descriptor.full_name())) {
    extra_base =
        absl::StrCat(", _well_known_types.", message_descriptor.name());
  } else {
    extra_base = "";
  }
  printer_->Print("class $class_name$(_message.Message$extra_base$):\n",
                  "class_name", class_name, "extra_base", extra_base);
  Annotate("class_name", &message_descriptor);
  printer_->Indent();

  // Prints slots
  printer_->Print("__slots__ = (");
  int items_printed = 0;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      continue;
    }
    if (items_printed > 0) {
      printer_->Print(", ");
    }
    ++items_printed;
    printer_->Print("\"$field_name$\"", "field_name", field_des->name());
  }
  printer_->Print(items_printed == 1 ? ",)\n" : ")\n");

  // Prints Extensions for extendable messages
  if (message_descriptor.extension_range_count() > 0) {
    printer_->Print("Extensions: _python_message._ExtensionDict\n");
  }

  // Prints nested enums
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    PrintEnum(*message_descriptor.enum_type(i));
    PrintEnumValues(*message_descriptor.enum_type(i));
  }

  // Prints nested messages
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    PrintMessage(*message_descriptor.nested_type(i), true);
  }

  PrintExtensions(message_descriptor);

  // Prints field number
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    printer_->Print(
        "$field_number_name$: _ClassVar[int]\n", "field_number_name",
        absl::StrCat(absl::AsciiStrToUpper(field_des.name()), "_FIELD_NUMBER"));
  }
  // Prints field name and type
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    if (IsPythonKeyword(field_des.name())) {
      continue;
    }
    std::string field_type = "";
    if (field_des.is_map()) {
      const FieldDescriptor* key_des = field_des.message_type()->field(0);
      const FieldDescriptor* value_des = field_des.message_type()->field(1);
      field_type =
          absl::StrCat(value_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                           ? "_containers.MessageMap["
                           : "_containers.ScalarMap[",
                       GetFieldType(*key_des, message_descriptor), ", ",
                       GetFieldType(*value_des, message_descriptor));
    } else {
      if (field_des.is_repeated()) {
        field_type = (field_des.cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                          ? "_containers.RepeatedCompositeFieldContainer["
                          : "_containers.RepeatedScalarFieldContainer[");
      }
      field_type += GetFieldType(field_des, message_descriptor);
    }

    if (field_des.is_repeated()) {
      absl::StrAppend(&field_type, "]");
    }
    printer_->Print("$name$: $type$\n",
                    "name", field_des.name(), "type", field_type);
    Annotate("name", &field_des);
  }

  // Prints __init__
  printer_->Print("def __init__(");
  // If the message has a field named "self" (see b/144146793), it can still be
  // passed to the initializer, which takes those as **kwargs. To avoid name
  // collision, we rename the self parameter by appending underscores until it
  // no longer collides. The self-parameter is in fact positional-only, so the
  // name in the pyi doesn't matter with regard to what runtime usage is valid.
  std::string self_arg_name = "self";
  while (message_descriptor.FindFieldByName(self_arg_name) != nullptr) {
    self_arg_name.append("_");
  }
  printer_->Print(self_arg_name);
  bool has_python_keywords = false;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      has_python_keywords = true;
      continue;
    }
    std::string field_name = std::string(field_des->name());
    printer_->Print(", $field_name$: ", "field_name", field_name);
    Annotate("field_name", field_des);
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("_Optional[");
    }
    if (field_des->is_map()) {
      const Descriptor* map_entry = field_des->message_type();
      printer_->Print(
          "_Mapping[$key_type$, $value_type$]", "key_type",
          GetFieldType(*map_entry->field(0), message_descriptor),
          "value_type",
          GetFieldType(*map_entry->field(1), message_descriptor));
    } else {
      if (field_des->is_repeated()) {
        printer_->Print("_Iterable[");
      }
      if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        const auto& extra_init_types =
            ExtraInitTypes(*field_des->message_type());
        printer_->Print("_Union[$extra_init_types$$type_name$, _Mapping]",
                        "extra_init_types", extra_init_types, "type_name",
                        GetFieldType(*field_des, message_descriptor));
      } else {
        if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
          printer_->Print("_Union[$type_name$, str]", "type_name",
                          ModuleLevelName(*field_des->enum_type()));
        } else {
          printer_->Print(
              "$type_name$", "type_name",
              GetFieldType(*field_des, message_descriptor));
        }
      }
      if (field_des->is_repeated()) {
        printer_->Print("]");
      }
    }
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("]");
    }
    printer_->Print(" = ...");
  }
  if (has_python_keywords) {
    printer_->Print(", **kwargs");
  }
  printer_->Print(") -> None: ...\n");
  printer_->Outdent();
}